

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCubicSpline.cpp
# Opt level: O1

void __thiscall
chrono::ChCubicSpline::Evaluate(ChCubicSpline *this,double t,double *y,double *yp,double *ypp)

{
  double dVar1;
  double *pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (this->m_process == true) {
    Process(this);
  }
  pdVar2 = (this->m_t).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (t < *pdVar2) {
    __assert_fail("t >= m_t[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChCubicSpline.cpp"
                  ,0x85,"void chrono::ChCubicSpline::Evaluate(double, double &, double &, double &)"
                 );
  }
  lVar9 = (long)(this->m_t).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (*(double *)((long)pdVar2 + lVar9 + -8) < t) {
    __assert_fail("t <= m_t[n - 1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChCubicSpline.cpp"
                  ,0x86,"void chrono::ChCubicSpline::Evaluate(double, double &, double &, double &)"
                 );
  }
  uVar10 = lVar9 >> 3;
  uVar11 = 0;
  if (1 < uVar10) {
    uVar11 = (int)uVar10 - 1;
    lVar9 = 0;
    do {
      if (t <= pdVar2[lVar9 + 1]) {
        uVar11 = (uint)lVar9;
        break;
      }
      lVar9 = lVar9 + 1;
    } while (uVar10 - 1 != lVar9);
  }
  uVar10 = (ulong)uVar11;
  dVar7 = pdVar2[uVar10 + 1] - pdVar2[uVar10];
  auVar12._0_8_ = (t - pdVar2[uVar10]) / dVar7;
  auVar12._8_8_ = 0;
  dVar5 = dVar7 * dVar7;
  pdVar3 = (this->m_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->m_ypp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar4[uVar10];
  dVar15 = (dVar5 * (pdVar4[uVar10 + 1] - dVar1)) / 6.0;
  dVar6 = dVar5 * dVar1 * 0.5;
  dVar1 = pdVar3[uVar10];
  dVar8 = ((pdVar3[uVar10 + 1] - dVar1) - dVar15) - dVar6;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar12._0_8_ * dVar15 * auVar12._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar12._0_8_ * dVar6 * auVar12._0_8_;
  auVar13 = vfmadd231sd_fma(auVar20,auVar12,auVar18);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar8;
  auVar13 = vfmadd231sd_fma(auVar13,auVar17,auVar12);
  *y = auVar13._0_8_ + dVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar12._0_8_ * dVar15 * 3.0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar12._0_8_ * (dVar6 + dVar6);
  auVar13 = vfmadd231sd_fma(auVar19,auVar12,auVar16);
  *yp = (auVar13._0_8_ + dVar8) / dVar7;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar15 * 6.0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar6 + dVar6;
  auVar13 = vfmadd213sd_fma(auVar13,auVar12,auVar14);
  *ypp = auVar13._0_8_ / dVar5;
  return;
}

Assistant:

void ChCubicSpline::Evaluate(double t, double& y, double& yp, double& ypp) {
    if (m_process)
        Process();

    auto n = m_t.size();
    assert(t >= m_t[0]);
    assert(t <= m_t[n - 1]);

    // Bracket the given value: m_t[i_left] < t <= m_t[i_left+1]
    int left = 0;
    for (size_t i = 1; i < n; i++) {
        if (t > m_t[i])
            left++;
        else
            break;
    }

    double dt = m_t[left + 1] - m_t[left];
    double tau = (t - m_t[left]) / dt;
    double a = dt * dt * (m_ypp[left + 1] - m_ypp[left]) / 6;
    double b = dt * dt * m_ypp[left] / 2;
    double c = (m_y[left + 1] - m_y[left]) - a - b;
    double d = m_y[left];

    y = a * tau * tau * tau + b * tau * tau + c * tau + d;
    yp = (3 * a * tau * tau + 2 * b * tau + c) / dt;
    ypp = (6 * a * tau + 2 * b) / (dt * dt);
}